

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::SetMaximumPacketSize(RTPUDPv6Transmitter *this,size_t s)

{
  size_t s_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else if (s < 0x10000) {
    this->maxpacksize = s;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0x75;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (s > RTPUDPV6TRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}